

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int nettlp_msg_get_msix_table(in_addr addr,nettlp_msix *msix,int msix_count)

{
  ssize_t sVar1;
  int *piVar2;
  int in_EDX;
  void *in_RSI;
  pollfd x [1];
  int ret;
  int req;
  int sock;
  pollfd local_28;
  int local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  int local_4;
  
  local_20 = 0;
  local_14 = in_EDX;
  local_18 = nettlp_msg_socket((in_addr)(in_addr_t)in_RSI);
  if (local_18 < 1) {
    local_4 = 0;
  }
  else {
    local_1c = 3;
    sVar1 = write(local_18,&local_1c,4);
    local_20 = (int)sVar1;
    local_28.fd = local_18;
    local_28.events = 1;
    local_20 = poll(&local_28,1,500);
    if (local_20 == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0x3e;
    }
    else {
      sVar1 = read(local_18,in_RSI,(long)local_14 * 0xc);
      local_20 = (int)sVar1;
      if (-1 < local_20) {
        close(local_18);
        return 0;
      }
    }
    close(local_18);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int nettlp_msg_get_msix_table(struct in_addr addr, struct nettlp_msix *msix,
			      int msix_count)
{
	int sock, req, ret = 0;
	struct pollfd x[1];

	sock = nettlp_msg_socket(addr);
	if (sock < 1)
		return 0;

	/* send GET_BAR4 request */
	req = NETTLP_MSG_GET_MSIX_TABLE;
	ret = write(sock, &req, sizeof(req));

	/* recv response with timeout */
	x[0].fd = sock;
	x[0].events = POLLIN;

	ret = poll(x, 1, LIBTLP_CPL_TIMEOUT);
	if (ret == 0) {
		errno = ETIME;
		goto err_out;
	}

	ret = read(sock, msix, sizeof(struct nettlp_msix) * msix_count);
	if (ret < 0)
		goto err_out;

	close(sock);
	return 0;

err_out:
	close(sock);
	return -1;
}